

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigCone.c
# Opt level: O3

void Saig_ManPrintConeOne(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  size_t __size;
  void **ppvVar1;
  Vec_Ptr_t *pVVar2;
  uint *__ptr;
  void *pvVar3;
  Vec_Ptr_t *vNodes;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  Vec_Ptr_t *local_60;
  int local_54;
  ulong local_50;
  
  if (((*(uint *)&pObj->field_0x18 & 7) != 3) || (p->nTruePos <= (pObj->field_0).CioId)) {
    __assert_fail("Saig_ObjIsPo(p, pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigCone.c"
                  ,0x6b,"void Saig_ManPrintConeOne(Aig_Man_t *, Aig_Obj_t *)");
  }
  local_60 = (Vec_Ptr_t *)malloc(0x10);
  local_60->nCap = 100;
  ppvVar1 = (void **)malloc(800);
  local_60->pArray = ppvVar1;
  local_60->nSize = 1;
  *ppvVar1 = pObj;
  pVVar2 = Saig_ManSupport(p,local_60);
  local_60->nSize = 0;
  if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
    __assert_fail("!Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                  ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
  }
  printf("    PO %3d  ");
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar3 = malloc(800);
  *(void **)(__ptr + 2) = pvVar3;
  uVar8 = 0;
  while (vNodes = pVVar2, uVar5 = (ulong)(uint)vNodes->nSize, vNodes->nSize < 1) {
    uVar10 = 0;
    local_50 = 0;
    local_54 = 0;
LAB_006e03d0:
    if ((int)local_50 + (int)uVar10 + local_54 != (int)uVar5) {
      __assert_fail("nCurNew + nCurPrev + nCurOld == Vec_PtrSize(vCur)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigCone.c"
                    ,0x85,"void Saig_ManPrintConeOne(Aig_Man_t *, Aig_Obj_t *)");
    }
    printf("%d:%d %d=%d+%d+%d  ",(ulong)uVar8,(ulong)__ptr[1],uVar5,uVar10,local_50,local_54);
    if ((int)uVar10 == 0) {
      putchar(10);
      if (local_60->pArray != (void **)0x0) {
        free(local_60->pArray);
      }
      free(local_60);
      if (vNodes->pArray != (void **)0x0) {
        free(vNodes->pArray);
      }
      free(vNodes);
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
      }
      free(__ptr);
      return;
    }
    if (local_60->pArray != (void **)0x0) {
      free(local_60->pArray);
    }
    free(local_60);
    pVVar2 = Saig_ManSupport(p,vNodes);
    uVar8 = uVar8 + 1;
    local_60 = vNodes;
  }
  uVar11 = __ptr[1];
  lVar7 = 0;
  local_54 = 0;
  local_50 = 0;
  uVar10 = 0;
LAB_006e02b9:
  pvVar3 = vNodes->pArray[lVar7];
  if (0 < (int)uVar11) {
    uVar9 = 0;
    do {
      if (*(void **)(*(long *)(__ptr + 2) + uVar9 * 8) == pvVar3) {
        if ((long)local_60->nSize < 1) goto LAB_006e0331;
        lVar6 = 0;
        goto LAB_006e0323;
      }
      uVar9 = uVar9 + 1;
    } while (uVar11 != uVar9);
  }
  if (uVar11 == *__ptr) {
    if ((int)uVar11 < 0x10) {
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar4 = malloc(0x80);
      }
      else {
        pvVar4 = realloc(*(void **)(__ptr + 2),0x80);
      }
      *(void **)(__ptr + 2) = pvVar4;
      *__ptr = 0x10;
    }
    else {
      __size = (ulong)(uVar11 * 2) * 8;
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar4 = malloc(__size);
      }
      else {
        pvVar4 = realloc(*(void **)(__ptr + 2),__size);
      }
      *(void **)(__ptr + 2) = pvVar4;
      *__ptr = uVar11 * 2;
    }
  }
  else {
    pvVar4 = *(void **)(__ptr + 2);
  }
  lVar6 = (long)(int)uVar11;
  uVar11 = uVar11 + 1;
  __ptr[1] = uVar11;
  *(void **)((long)pvVar4 + lVar6 * 8) = pvVar3;
  uVar10 = (ulong)((int)uVar10 + 1);
  uVar5 = (ulong)(uint)vNodes->nSize;
  goto LAB_006e03ab;
  while (lVar6 = lVar6 + 1, local_60->nSize != lVar6) {
LAB_006e0323:
    if (local_60->pArray[lVar6] == pvVar3) {
      local_50 = (ulong)((int)local_50 + 1);
      goto LAB_006e03ab;
    }
  }
LAB_006e0331:
  local_54 = local_54 + 1;
LAB_006e03ab:
  lVar7 = lVar7 + 1;
  if ((int)uVar5 <= lVar7) goto LAB_006e03d0;
  goto LAB_006e02b9;
}

Assistant:

void Saig_ManPrintConeOne( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Vec_Ptr_t * vPrev, * vCur, * vTotal;
    int s, i, nCurNew, nCurPrev, nCurOld;
    assert( Saig_ObjIsPo(p, pObj) );
    // start the array
    vPrev = Vec_PtrAlloc( 100 );
    Vec_PtrPush( vPrev, pObj );
    // get the current support
    vCur = Saig_ManSupport( p, vPrev );  
    Vec_PtrClear( vPrev );
    printf( "    PO %3d  ", Aig_ObjCioId(pObj) );
    // continue computing supports as long as there are now nodes
    vTotal = Vec_PtrAlloc( 100 );
    for ( s = 0; ; s++ )
    {
        // classify current into those new, prev, and older 
        nCurNew = nCurPrev = nCurOld = 0;
        Vec_PtrForEachEntry( Aig_Obj_t *, vCur, pObj, i )
        {
            if ( Vec_PtrFind(vTotal, pObj) == -1 )
            {
                Vec_PtrPush( vTotal, pObj );
                nCurNew++;
            }
            else if ( Vec_PtrFind(vPrev, pObj) >= 0 )
                nCurPrev++;
            else
                nCurOld++;
        }
        assert( nCurNew + nCurPrev + nCurOld == Vec_PtrSize(vCur) );
        // print the result
        printf( "%d:%d %d=%d+%d+%d  ", s, Vec_PtrSize(vTotal), Vec_PtrSize(vCur), nCurNew, nCurPrev, nCurOld ); 
        if ( nCurNew == 0 )
            break;
        // compute one more step
        Vec_PtrFree( vPrev );
        vCur = Saig_ManSupport( p, vPrev = vCur );
    }
    printf( "\n" );
    Vec_PtrFree( vPrev );
    Vec_PtrFree( vCur );
    Vec_PtrFree( vTotal );
}